

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.h
# Opt level: O3

spawn_ret_t depspawn::spawn<boost::function<void(int&)>,int&>(function<void_(int_&)> *f,int *args)

{
  arg_info *this;
  Workitem *this_00;
  Task *itask;
  arg_info *pargs;
  arg_info *local_30;
  reference_wrapper<int> local_28;
  
  local_30 = (arg_info *)0x0;
  this = LinkedListPool<depspawn::internal::arg_info,_true,_false>::intl_malloc
                   ((LinkedListPool<depspawn::internal::arg_info,_true,_false> *)
                    internal::arg_info::Pool);
  this->size = 4;
  this->wr = true;
  this->rank = '\0';
  this->addr = (value_t)args;
  this->array_range = (array_range_t *)0x0;
  this->next = (arg_info *)0x0;
  internal::arg_info::insert_in_arglist(this,&local_30);
  if ((internal::TP == (TaskPool *)0x0) || (internal::TP->finish_ == true)) {
    internal::start_master();
  }
  this_00 = LinkedListPool<depspawn::internal::Workitem,_true,_false>::intl_malloc
                      ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)
                       internal::Workitem::Pool);
  internal::Workitem::Workitem(this_00,local_30,1);
  local_28._M_data = args;
  itask = internal::TaskPool::
          build_task<boost::function<void(int&)>const&,std::reference_wrapper<int>>
                    (internal::TP,this_00,f,&local_28);
  internal::Workitem::insert_in_worklist(this_00,itask);
  return;
}

Assistant:

inline internal::spawn_ret_t spawn(const Function& f, Args&&... args) {
    using parameter_types = typename internal::ParameterTypes<Function>::type;

    internal::arg_info *pargs = nullptr;
    const int nargs = internal::fill_args<typename boost::mpl::begin<parameter_types>::type>(pargs, std::forward<Args>(args)...);

#ifdef DEPSPAWN_USE_TBB
    if(!internal::master_task)
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(new (tbb::task::allocate_additional_child_of(*internal::master_task)) internal::runner<decltype(std::bind(f, internal::ref<Args&&>::make(args)...))>(w, f, std::forward<Args>(args)...));
#else
    if(!internal::TP || !internal::TP->is_running())
      internal::start_master();
    
    internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);
    w->insert_in_worklist(internal::TP->build_task(w, f, internal::ref<Args&&>::make(args)...));
#endif
  }